

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseTextDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  int iVar3;
  xmlChar *pxVar4;
  
  pxVar2 = ctxt->input;
  pxVar4 = pxVar2->cur;
  if (((((*pxVar4 != '<') || (pxVar4[1] != '?')) || (pxVar4[2] != 'x')) ||
      ((pxVar4[3] != 'm' || (pxVar4[4] != 'l')))) ||
     ((0x20 < (ulong)pxVar4[5] || ((0x100002600U >> ((ulong)pxVar4[5] & 0x3f) & 1) == 0)))) {
    xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_STARTED,(char *)0x0);
    return;
  }
  pxVar2->cur = pxVar4 + 5;
  pxVar2->col = pxVar2->col + 5;
  if (pxVar4[5] == '\0') {
    xmlParserGrow(ctxt);
  }
  iVar3 = xmlSkipBlankChars(ctxt);
  if (iVar3 == 0) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s","Space needed after \'<?xml\'\n")
    ;
  }
  pxVar4 = xmlParseVersionInfo(ctxt);
  if (pxVar4 == (xmlChar *)0x0) {
    pxVar4 = xmlCharStrdup("1.0");
    if (pxVar4 == (xmlChar *)0x0) {
      xmlCtxtErrMemory(ctxt);
      return;
    }
  }
  else {
    iVar3 = xmlSkipBlankChars(ctxt);
    if (iVar3 == 0) {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s","Space needed here\n");
    }
  }
  ctxt->input->version = pxVar4;
  xmlParseEncodingDecl(ctxt);
  xmlSkipBlankChars(ctxt);
  pxVar2 = ctxt->input;
  pxVar4 = pxVar2->cur;
  if (*pxVar4 != '>') {
    if ((*pxVar4 == '?') && (pxVar4[1] == '>')) {
      pxVar2->cur = pxVar4 + 2;
      pxVar2->col = pxVar2->col + 2;
      if (pxVar4[2] == '\0') {
        xmlParserGrow(ctxt);
        return;
      }
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
      do {
        if (1 < ctxt->disableSAX) {
          return;
        }
        xVar1 = *ctxt->input->cur;
        if (xVar1 == '\0') {
          return;
        }
        xmlNextChar(ctxt);
      } while (xVar1 != '>');
    }
    return;
  }
  xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
  xmlNextChar(ctxt);
  return;
}

Assistant:

void
xmlParseTextDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *version;

    /*
     * We know that '<?xml' is here.
     */
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {
	SKIP(5);
    } else {
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_STARTED, NULL);
	return;
    }

    if (SKIP_BLANKS == 0) {
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		       "Space needed after '<?xml'\n");
    }

    /*
     * We may have the VersionInfo here.
     */
    version = xmlParseVersionInfo(ctxt);
    if (version == NULL) {
	version = xmlCharStrdup(XML_DEFAULT_VERSION);
        if (version == NULL) {
            xmlErrMemory(ctxt);
            return;
        }
    } else {
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space needed here\n");
	}
    }
    ctxt->input->version = version;

    /*
     * We must have the encoding declaration
     */
    xmlParseEncodingDecl(ctxt);

    SKIP_BLANKS;
    if ((RAW == '?') && (NXT(1) == '>')) {
        SKIP(2);
    } else if (RAW == '>') {
        /* Deprecated old WD ... */
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	NEXT;
    } else {
        int c;

	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
        while ((PARSER_STOPPED(ctxt) == 0) && ((c = CUR) != 0)) {
            NEXT;
            if (c == '>')
                break;
        }
    }
}